

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1224::run(TestCase1224 *this)

{
  word **this_00;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  __off_t extraout_RDX_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  uint local_398 [2];
  bool local_38d;
  uint local_38c;
  int iStack_388;
  bool _kj_shouldLog_6;
  DebugExpression<int> local_384;
  undefined1 local_380 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_6;
  bool local_355;
  uint local_354;
  int iStack_350;
  bool _kj_shouldLog_5;
  DebugExpression<int> local_34c;
  undefined1 local_348 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_5;
  uint local_320;
  uint i_2;
  bool local_315;
  uint local_314;
  uint uStack_310;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int> local_30c;
  undefined1 local_308 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_4;
  bool local_2dd;
  uint local_2dc;
  uint uStack_2d8;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_int> local_2d4;
  undefined1 local_2d0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_3;
  uint local_2a8;
  uint i_1;
  bool local_29d;
  uint local_29c;
  int iStack_298;
  bool _kj_shouldLog_2;
  DebugExpression<int> local_294;
  undefined1 local_290 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  size_t local_230;
  int local_228;
  bool local_221;
  undefined1 auStack_220 [7];
  bool _kj_shouldLog_1;
  size_t local_218;
  size_t local_210;
  int local_208;
  DebugExpression<int> local_204;
  undefined1 local_200 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  size_t local_1c8;
  int local_1c0;
  bool local_1b9;
  undefined1 auStack_1b8 [7];
  bool _kj_shouldLog;
  size_t local_1b0;
  size_t local_1a8;
  int local_1a0;
  DebugExpression<int> local_19c;
  undefined1 local_198 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  undefined1 local_168 [4];
  uint i;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder message;
  TestCase1224 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,&local_130,7);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_168,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  for (_kjCondition._36_4_ = 0; (uint)_kjCondition._36_4_ < 7;
      _kjCondition._36_4_ = _kjCondition._36_4_ + 1) {
    List<unsigned_int,_(capnp::Kind)0>::Builder::set
              ((Builder *)local_168,_kjCondition._36_4_,_kjCondition._36_4_ + 0x75bcd15);
  }
  local_1a0 = 5;
  local_19c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a0);
  _auStack_1b8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1b8,0);
  local_1a8 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_198,&local_19c,&local_1a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  __length = extraout_RDX;
  if (!bVar1) {
    local_1b9 = kj::_::Debug::shouldLog(ERROR);
    __length = extraout_RDX_00;
    while (local_1b9 != false) {
      local_1c0 = 5;
      AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      _kjCondition_1._32_8_ = AVar3.ptr;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_1.result
                          ,0);
      local_1c8 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d0,ERROR,
                 "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_198,&local_1c0,&local_1c8);
      __length = extraout_RDX_01;
      local_1b9 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::truncate
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,(char *)0xb,__length);
  local_208 = 7;
  local_204 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_208);
  _auStack_220 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_220,0);
  local_210 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_200,&local_204,&local_210);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar1) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      local_228 = 7;
      AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      reader.reader._40_8_ = AVar3.ptr;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
                          &reader.reader.nestingLimit,0);
      local_230 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d2,ERROR,
                 "\"failed: expected \" \"(7) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 7, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (7) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_200,&local_228,&local_230);
      local_221 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&_kjCondition_2.result,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  iStack_298 = 0xb;
  local_294 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd68);
  local_29c = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_2.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_290,&local_294,&local_29c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_290);
  if (!bVar1) {
    local_29d = kj::_::Debug::shouldLog(ERROR);
    while (local_29d != false) {
      i_1 = 0xb;
      local_2a8 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_2.result)
      ;
      kj::_::Debug::
      log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d5,ERROR,
                 "\"failed: expected \" \"(11) == (reader.size())\", _kjCondition, 11, reader.size()"
                 ,(char (*) [41])"failed: expected (11) == (reader.size())",
                 (DebugComparison<int,_unsigned_int> *)local_290,(int *)&i_1,&local_2a8);
      local_29d = false;
    }
  }
  for (_kjCondition_3._28_4_ = 0; (uint)_kjCondition_3._28_4_ < 7;
      _kjCondition_3._28_4_ = _kjCondition_3._28_4_ + 1) {
    uStack_2d8 = _kjCondition_3._28_4_ + 0x75bcd15;
    local_2d4 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd28);
    local_2dc = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition_2.result,_kjCondition_3._28_4_);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_2d0,&local_2d4,&local_2dc);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d0);
    if (!bVar1) {
      local_2dd = kj::_::Debug::shouldLog(ERROR);
      while (local_2dd != false) {
        _kjCondition_4._28_4_ = _kjCondition_3._28_4_ + 0x75bcd15;
        _kjCondition_4._24_4_ =
             List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                       ((Reader *)&_kjCondition_2.result,_kjCondition_3._28_4_);
        kj::_::Debug::
        log<char_const(&)[48],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4d8,ERROR,
                   "\"failed: expected \" \"(123456789 + i) == (reader[i])\", _kjCondition, 123456789 + i, reader[i]"
                   ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_2d0,
                   (uint *)&_kjCondition_4.field_0x1c,(uint *)&_kjCondition_4.result);
        local_2dd = false;
      }
    }
    uStack_310 = _kjCondition_3._28_4_ + 0x75bcd15;
    local_30c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcf0);
    local_314 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                          ((Builder *)local_168,_kjCondition_3._28_4_);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_308,&local_30c,&local_314);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_308);
    if (!bVar1) {
      local_315 = kj::_::Debug::shouldLog(ERROR);
      while (local_315 != false) {
        i_2 = _kjCondition_3._28_4_ + 0x75bcd15;
        local_320 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                              ((Builder *)local_168,_kjCondition_3._28_4_);
        kj::_::Debug::
        log<char_const(&)[49],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4d9,ERROR,
                   "\"failed: expected \" \"(123456789 + i) == (builder[i])\", _kjCondition, 123456789 + i, builder[i]"
                   ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_308,&i_2,&local_320);
        local_315 = false;
      }
    }
  }
  for (_kjCondition_5._28_4_ = 7; (uint)_kjCondition_5._28_4_ < 0xb;
      _kjCondition_5._28_4_ = _kjCondition_5._28_4_ + 1) {
    iStack_350 = 0;
    local_34c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcb0);
    local_354 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition_2.result,_kjCondition_5._28_4_);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int> *)local_348,&local_34c,&local_354);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_348);
    if (!bVar1) {
      local_355 = kj::_::Debug::shouldLog(ERROR);
      while (local_355 != false) {
        _kjCondition_6._28_4_ = 0;
        _kjCondition_6._24_4_ =
             List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                       ((Reader *)&_kjCondition_2.result,_kjCondition_5._28_4_);
        kj::_::Debug::
        log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4dc,ERROR,
                   "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                   (char (*) [36])"failed: expected (0) == (reader[i])",
                   (DebugComparison<int,_unsigned_int> *)local_348,(int *)&_kjCondition_6.field_0x1c
                   ,(uint *)&_kjCondition_6.result);
        local_355 = false;
      }
    }
  }
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)local_168,0,0x141);
  iStack_388 = 0x141;
  local_384 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc78);
  local_38c = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                        ((Reader *)&_kjCondition_2.result,0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_380,&local_384,&local_38c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_380);
  if (!bVar1) {
    local_38d = kj::_::Debug::shouldLog(ERROR);
    while (local_38d != false) {
      local_398[1] = 0x141;
      local_398[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                               ((Reader *)&_kjCondition_2.result,0);
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4e2,ERROR,
                 "\"failed: expected \" \"(321) == (reader[0])\", _kjCondition, 321, reader[0]",
                 (char (*) [38])"failed: expected (321) == (reader[0])",
                 (DebugComparison<int,_unsigned_int> *)local_380,(int *)(local_398 + 1),local_398);
      local_38d = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(11);
  EXPECT_EQ(7, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(123456789 + i, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}